

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.c
# Opt level: O3

int linux_kevent_copyout(kqueue *kq,int nready,kevent *el,int nevents)

{
  int iVar1;
  long *plVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  kevent *pkVar9;
  kevent *pkVar10;
  epoll_event *ev;
  ushort *puVar11;
  
  pkVar10 = el;
  if (0 < nready) {
    uVar7 = (ulong)(uint)nready;
    pkVar9 = el + nevents;
    lVar4 = __tls_get_addr(&PTR_0010bfd0);
    puVar11 = (ushort *)(lVar4 + 0x1930);
    do {
      plVar2 = *(long **)(puVar11 + 2);
      if (plVar2 != (long *)0x0) {
        iVar1 = (int)plVar2[1];
        if (iVar1 == 3) {
          uVar8 = (ulong)((long)pkVar9 - (long)pkVar10) >> 5;
          lVar5 = *(long *)(*plVar2 + 8);
          lVar4 = 0;
        }
        else if (iVar1 == 2) {
          lVar5 = *(long *)(*plVar2 + 0x28);
          lVar4 = *(long *)(*plVar2 + 0x30);
          if ((lVar5 != 0) && ((*puVar11 & 0x2019) != 0)) {
            if ((pkVar9 <= pkVar10) ||
               (lVar6 = ~(long)*(short *)(lVar5 + 8) * 0xa0 + *(long *)(lVar5 + 0x28),
               uVar3 = (**(code **)(lVar6 + 0x48))
                                 (pkVar10,(ulong)((long)pkVar9 - (long)pkVar10) >> 5,lVar6 + 0x18,
                                  lVar5,puVar11), (int)uVar3 < 0)) break;
            if (pkVar10->filter == 0) {
              uVar3 = 0;
            }
            pkVar10 = pkVar10 + uVar3;
          }
          if ((lVar4 == 0) || ((*puVar11 & 0x1c) == 0)) goto LAB_0010474e;
          if (pkVar9 <= pkVar10) break;
          uVar8 = (ulong)((long)pkVar9 - (long)pkVar10) >> 5;
          lVar5 = *(long *)(lVar4 + 0x28) + ~(long)*(short *)(lVar4 + 8) * 0xa0 + 0x18;
        }
        else {
          if (iVar1 != 1) {
            return -1;
          }
          if (pkVar9 <= pkVar10) break;
          lVar4 = *plVar2;
          uVar8 = (ulong)((long)pkVar9 - (long)pkVar10) >> 5;
          lVar5 = ~(long)*(short *)(lVar4 + 8) * 0xa0 + *(long *)(lVar4 + 0x28) + 0x18;
        }
        uVar3 = (**(code **)(lVar5 + 0x30))(pkVar10,uVar8,lVar5,lVar4,puVar11);
        if ((int)uVar3 < 0) break;
        if (pkVar10->filter == 0) {
          uVar3 = 0;
        }
        pkVar10 = pkVar10 + uVar3;
      }
LAB_0010474e:
      puVar11 = puVar11 + 6;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  return (int)((ulong)((long)pkVar10 - (long)el) >> 5);
}

Assistant:

int
linux_kevent_copyout(struct kqueue *kq, int nready, struct kevent *el, int nevents)
{
    struct kevent   *el_p = el, *el_end = el + nevents;
    int             i;

    dbg_printf("got %i events from epoll", nready);

    for (i = 0; i < nready; i++) {
        struct epoll_event    *ev = &epoll_events[i];    /* Thread local storage populated in linux_kevent_wait */
        struct epoll_udata    *epoll_udata = ev->data.ptr;
        int                   rv;

        if (!epoll_udata) {
            dbg_puts("event has no knote, skipping..."); /* Forgot to call KN_UDATA()? */
            continue;
        }

        dbg_printf("[%i] %s", i, epoll_event_dump(ev));

        /*
         * epoll event is associated with a single filter
         * so we just have one knote per event.
         *
         * As different filters store pointers to different
         * structures, we need to examine ud_type to figure
         * out what epoll_data contains.
         */
        switch (epoll_udata->ud_type) {
        case EPOLL_UDATA_KNOTE:
        {
            struct knote *kn = epoll_udata->ud_kn;

            assert(kn);
            if (el_p >= el_end) {
            oos:
                dbg_printf("no more available kevent slots, used %zu", el_p - el);
                goto done;
            }

            rv = linux_kevent_copyout_ev(el_p, (el_end - el_p), ev, knote_get_filter(kn), kn);
            if (rv < 0) goto done;
            el_p += rv;
        }
            break;

        /*
         * epoll event is associated with one filter for
         * reading and one filter for writing.
         */
        case EPOLL_UDATA_FD_STATE:
        {
            struct fd_state   *fds = epoll_udata->ud_fds;
            struct knote      *kn, *write;
            assert(fds);

            /*
             * fds can be freed after the first linux_kevent_copyout_ev
             * so cache the pointer value here.
             */
            write = fds->fds_write;

            /*
             *    FD, or errored, or other side shutdown
             */
            if ((kn = fds->fds_read) && (ev->events & (EPOLLIN | EPOLLHUP | EPOLLRDHUP | EPOLLERR))) {
                if (el_p >= el_end) goto oos;

                rv = linux_kevent_copyout_ev(el_p, (el_end - el_p), ev, knote_get_filter(kn), kn);
                if (rv < 0) goto done;
                el_p += rv;
            }

            /*
             *    FD is writable, or errored, or other side shutdown
             */
            if ((kn = write) && (ev->events & (EPOLLOUT | POLLHUP | EPOLLERR))) {
                if (el_p >= el_end) goto oos;

                rv = linux_kevent_copyout_ev(el_p, (el_end - el_p), ev, knote_get_filter(kn), kn);
                if (rv < 0) goto done;
                el_p += rv;
            }
        }
            break;

        case EPOLL_UDATA_EVENT_FD:
        {
            struct eventfd    *efd = epoll_udata->ud_efd;

            assert(efd);

            rv = linux_kevent_copyout_ev(el_p, (el_end - el_p), ev, efd->ef_filt, NULL);
            if (rv < 0) goto done;
            el_p += rv;
            break;
        }

        /*
         *    Bad udata value. Maybe use after free?
         */
        default:
            assert(0);
            return (-1);
        }
    }

done:
    return el_p - el;
}